

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

bool * __thiscall google::protobuf::RepeatedField<bool>::at(RepeatedField<bool> *this,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "third_party/sentencepiece/src/../third_party/protobuf-lite/google/protobuf/repeated_field.h"
               ,0x523);
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "third_party/sentencepiece/src/../third_party/protobuf-lite/google/protobuf/repeated_field.h"
               ,0x524);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_91,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  return (bool *)((long)index + (long)this->arena_or_elements_);
}

Assistant:

inline Element& RepeatedField<Element>::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}